

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O2

Vec2 __thiscall Randomizer::randPosition(Randomizer *this)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = randXAxis(this);
  fVar3 = randYAxis(this);
  VVar1.y = fVar3;
  VVar1.x = fVar2;
  return VVar1;
}

Assistant:

Vec2 Randomizer::randPosition()
{
    return Vec2(randXAxis(), randYAxis());
}